

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O1

Fraig_NodeVec_t * Fraig_UtilInfoAlloc(int nSize,int nWords,int fClean)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t *__s;
  ulong uVar2;
  
  if ((0 < nSize) && (0 < nWords)) {
    pFVar1 = Fraig_NodeVecAlloc(nSize);
    __s = (Fraig_Node_t *)malloc((ulong)(uint)(nWords * nSize) << 2);
    *pFVar1->pArray = __s;
    if (fClean != 0) {
      memset(__s,0,(ulong)(uint)nWords * (ulong)(uint)nSize * 4);
    }
    if (1 < nSize) {
      uVar2 = 1;
      do {
        pFVar1->pArray[uVar2] = (Fraig_Node_t *)(&pFVar1->pArray[uVar2 - 1]->Num + (uint)nWords);
        uVar2 = uVar2 + 1;
      } while ((uint)nSize != uVar2);
    }
    pFVar1->nSize = nSize;
    return pFVar1;
  }
  __assert_fail("nSize > 0 && nWords > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigMan.c"
                ,0x18a,"Fraig_NodeVec_t *Fraig_UtilInfoAlloc(int, int, int)");
}

Assistant:

Fraig_NodeVec_t * Fraig_UtilInfoAlloc( int nSize, int nWords, int fClean )
{
    Fraig_NodeVec_t * vInfo;
    unsigned * pUnsigned;
    int i;
    assert( nSize > 0 && nWords > 0 );
    vInfo = Fraig_NodeVecAlloc( nSize );
    pUnsigned = ABC_ALLOC( unsigned, nSize * nWords );
    vInfo->pArray[0] = (Fraig_Node_t *)pUnsigned;
    if ( fClean )
        memset( pUnsigned, 0, sizeof(unsigned) * nSize * nWords );
    for ( i = 1; i < nSize; i++ )
        vInfo->pArray[i] = (Fraig_Node_t *)(((unsigned *)vInfo->pArray[i-1]) + nWords);
    vInfo->nSize = nSize;
    return vInfo;
}